

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall
doctest::anon_unknown_14::JUnitReporter::test_case_reenter(JUnitReporter *this,TestCaseData *in)

{
  undefined8 uVar1;
  double dVar2;
  ticks_t tVar3;
  char *pcVar4;
  TestCaseData *file;
  undefined1 auVar5 [64];
  allocator local_82;
  allocator local_81;
  string local_80;
  string local_60;
  vector<doctest::String,_std::allocator<doctest::String>_> local_40;
  undefined1 extraout_var [56];
  
  auVar5._0_8_ = detail::Timer::getElapsedSeconds(&this->timer);
  auVar5._8_56_ = extraout_var;
  uVar1 = vcmpsd_avx512f(auVar5._0_16_,ZEXT816(0x3f1a36e2eb1c432d),1);
  dVar2 = (double)((ulong)!(bool)((byte)uVar1 & 1) * (long)auVar5._0_8_);
  (this->testCaseData).testcases.
  super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1].time = dVar2;
  (this->testCaseData).totalSeconds = dVar2 + (this->testCaseData).totalSeconds;
  std::vector<doctest::String,_std::allocator<doctest::String>_>::vector
            (&local_40,&this->deepestSubcaseStackNames);
  JUnitTestCaseData::appendSubcaseNamesToLastTestcase(&this->testCaseData,&local_40);
  std::vector<doctest::String,_std::allocator<doctest::String>_>::~vector(&local_40);
  std::vector<doctest::String,_std::allocator<doctest::String>_>::clear
            (&this->deepestSubcaseStackNames);
  tVar3 = detail::getCurrentTicks();
  (this->timer).m_ticks = tVar3;
  file = in;
  if ((in->m_file).field_0.buf[0x17] < '\0') {
    file = (TestCaseData *)(in->m_file).field_0.data.ptr;
  }
  pcVar4 = skipPathFromFilename((char *)file);
  std::__cxx11::string::string((string *)&local_60,pcVar4,&local_81);
  std::__cxx11::string::string((string *)&local_80,in->m_name,&local_82);
  JUnitTestCaseData::add(&this->testCaseData,&local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void test_case_reenter(const TestCaseData& in) override {
            testCaseData.addTime(timer.getElapsedSeconds());
            testCaseData.appendSubcaseNamesToLastTestcase(deepestSubcaseStackNames);
            deepestSubcaseStackNames.clear();

            timer.start();
            testCaseData.add(skipPathFromFilename(in.m_file.c_str()), in.m_name);
        }